

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

void PushWarnings(vector<bilingual_str,_std::allocator<bilingual_str>_> *warnings,UniValue *obj)

{
  pointer pbVar1;
  string key;
  UniValue val;
  UniValue val_00;
  pointer val_01;
  long in_FS_OFFSET;
  undefined8 in_stack_fffffffffffffec8;
  VType VVar2;
  undefined4 in_stack_fffffffffffffedc;
  _Alloc_hider _Var3;
  size_type sVar4;
  undefined1 uVar5;
  undefined7 uVar6;
  undefined1 uVar7;
  undefined4 uVar8;
  undefined2 uVar9;
  undefined1 uVar10;
  pointer pbVar11;
  pointer pbVar12;
  pointer pbVar13;
  pointer pUVar14;
  pointer pUVar15;
  pointer pUVar16;
  long *plVar17;
  pointer in_stack_ffffffffffffff38;
  long local_c0 [2];
  UniValue local_b0;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48 [9];
  undefined4 local_3f;
  undefined2 local_3b;
  char local_39;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((warnings->super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>)._M_impl.
      super__Vector_impl_data._M_start !=
      (warnings->super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    plVar17 = local_c0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xffffffffffffff30,"warnings","");
    local_b0.typ._0_1_ =
         (warnings->super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>)._M_impl.
         super__Vector_impl_data._M_start !=
         (warnings->super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    inline_check_non_fatal<bool>
              ((bool *)&local_b0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/util.cpp"
               ,0x560,"BilingualStringsToUniValue","!bilingual_strings.empty()");
    local_58 = local_48;
    local_50 = 0;
    _Var3._M_p = &stack0xfffffffffffffef0;
    VVar2 = VARR;
    uVar5 = '\0';
    uVar6 = (undefined7)local_48._1_8_;
    uVar7 = SUB81(local_48._1_8_,7);
    sVar4 = 0;
    local_48[0] = 0;
    pbVar11 = (pointer)0x0;
    pbVar12 = (pointer)0x0;
    pbVar13 = (pointer)0x0;
    pUVar14 = (pointer)0x0;
    pUVar15 = (pointer)0x0;
    pUVar16 = (pointer)0x0;
    val_01 = (warnings->super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pbVar1 = (warnings->super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    uVar8 = local_3f;
    uVar9 = local_3b;
    uVar10 = local_39;
    if (val_01 != pbVar1) {
      do {
        UniValue::
        UniValue<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  (&local_b0,&val_01->original);
        val.val._M_dataplus._M_p = (pointer)obj;
        val._0_8_ = in_stack_fffffffffffffec8;
        val.val._M_string_length._0_4_ = VVar2;
        val.val._M_string_length._4_4_ = in_stack_fffffffffffffedc;
        val.val.field_2._M_allocated_capacity = (size_type)_Var3._M_p;
        val.val.field_2._8_8_ = sVar4;
        val.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start._0_1_ = uVar5;
        val.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start._1_7_ = uVar6;
        val.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish._0_1_ = uVar7;
        val.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish._1_4_ = uVar8;
        val.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish._5_2_ = uVar9;
        val.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish._7_1_ = uVar10;
        val.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar11;
        val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)pbVar12;
        val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)pbVar13;
        val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = pUVar14;
        UniValue::push_back((UniValue *)&stack0xfffffffffffffed8,val);
        std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_b0.values);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_b0.keys);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0.val._M_dataplus._M_p != &local_b0.val.field_2) {
          operator_delete(local_b0.val._M_dataplus._M_p,
                          local_b0.val.field_2._M_allocated_capacity + 1);
        }
        val_01 = val_01 + 1;
      } while (val_01 != pbVar1);
    }
    key._M_string_length = (size_type)obj;
    key._M_dataplus._M_p = (pointer)in_stack_fffffffffffffec8;
    key.field_2._M_allocated_capacity._0_4_ = VVar2;
    key.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffedc;
    key.field_2._8_8_ = _Var3._M_p;
    val_00.val._M_dataplus._M_p._0_1_ = uVar5;
    val_00._0_8_ = sVar4;
    val_00.val._M_dataplus._M_p._1_7_ = uVar6;
    val_00.val._M_string_length._0_1_ = uVar7;
    val_00.val._M_string_length._1_4_ = uVar8;
    val_00.val._M_string_length._5_2_ = uVar9;
    val_00.val._M_string_length._7_1_ = uVar10;
    val_00.val.field_2._M_allocated_capacity = (size_type)pbVar11;
    val_00.val.field_2._8_8_ = pbVar12;
    val_00.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = pbVar13;
    val_00.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)pUVar14;
    val_00.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pUVar15;
    val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = pUVar16;
    val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)plVar17;
    val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = in_stack_ffffffffffffff38;
    UniValue::pushKV(obj,key,val_00);
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector
              ((vector<UniValue,_std::allocator<UniValue>_> *)&stack0xffffffffffffff18);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&stack0xffffffffffffff00);
    if (_Var3._M_p != &stack0xfffffffffffffef0) {
      operator_delete(_Var3._M_p,CONCAT71(uVar6,uVar5) + 1);
    }
    if (plVar17 != local_c0) {
      operator_delete(plVar17,local_c0[0] + 1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PushWarnings(const std::vector<bilingual_str>& warnings, UniValue& obj)
{
    if (warnings.empty()) return;
    obj.pushKV("warnings", BilingualStringsToUniValue(warnings));
}